

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheetContainer.cpp
# Opt level: O0

void __thiscall
Rml::StyleSheetContainer::MergeStyleSheetContainer
          (StyleSheetContainer *this,StyleSheetContainer *other)

{
  code *pcVar1;
  bool bVar2;
  reference __args;
  MediaBlock *block_other;
  __normal_iterator<const_Rml::MediaBlock_*,_std::vector<Rml::MediaBlock,_std::allocator<Rml::MediaBlock>_>_>
  local_28;
  const_iterator it;
  const_iterator it_other_begin;
  StyleSheetContainer *other_local;
  StyleSheetContainer *this_local;
  
  if ((this->compiled_style_sheet != (StyleSheet *)0x0) &&
     (bVar2 = Assert("RMLUI_ASSERT(!compiled_style_sheet)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/StyleSheetContainer.cpp"
                     ,0xd4), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  local_28._M_current =
       (MediaBlock *)
       ::std::vector<Rml::MediaBlock,_std::allocator<Rml::MediaBlock>_>::begin(&other->media_blocks)
  ;
  it = (const_iterator)local_28._M_current;
  while( true ) {
    block_other = (MediaBlock *)
                  ::std::vector<Rml::MediaBlock,_std::allocator<Rml::MediaBlock>_>::end
                            (&other->media_blocks);
    bVar2 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_Rml::MediaBlock_*,_std::vector<Rml::MediaBlock,_std::allocator<Rml::MediaBlock>_>_>
                        *)&block_other);
    if (!bVar2) break;
    __args = __gnu_cxx::
             __normal_iterator<const_Rml::MediaBlock_*,_std::vector<Rml::MediaBlock,_std::allocator<Rml::MediaBlock>_>_>
             ::operator*(&local_28);
    ::std::vector<Rml::MediaBlock,std::allocator<Rml::MediaBlock>>::
    emplace_back<Rml::PropertyDictionary_const&,std::shared_ptr<Rml::StyleSheet>const&,Rml::MediaQueryModifier_const&>
              ((vector<Rml::MediaBlock,std::allocator<Rml::MediaBlock>> *)&this->media_blocks,
               &__args->properties,&__args->stylesheet,&__args->modifier);
    __gnu_cxx::
    __normal_iterator<const_Rml::MediaBlock_*,_std::vector<Rml::MediaBlock,_std::allocator<Rml::MediaBlock>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void StyleSheetContainer::MergeStyleSheetContainer(const StyleSheetContainer& other)
{
	RMLUI_ZoneScoped;

	// Style sheet container must not be merged after it's been compiled. This will invalidate references to the compiled style sheet.
	RMLUI_ASSERT(!compiled_style_sheet);

	auto it_other_begin = other.media_blocks.begin();

#if 0
	// If the last block here has the same media requirements as the first block in other, we can safely merge them
	// while retaining correct specificity of all properties. This is essentially an optimization to avoid more
	// style sheet merging later on.
	if (!media_blocks.empty() && !other.media_blocks.empty())
	{
		MediaBlock& block_local = media_blocks.back();
		const MediaBlock& block_other = other.media_blocks.front();
		if (block_local.properties.GetProperties() == block_other.properties.GetProperties())
		{
			// Now we can safely merge the two style sheets.
			block_local.stylesheet = block_local.stylesheet->CombineStyleSheet(*block_other.stylesheet);

			// And we need to skip the first media block in the 'other' style sheet, since we merged it just now.
			++it_other_begin;
		}
	}
#endif

	// Add all the other blocks into ours.
	for (auto it = it_other_begin; it != other.media_blocks.end(); ++it)
	{
		const MediaBlock& block_other = *it;
		media_blocks.emplace_back(block_other.properties, block_other.stylesheet, block_other.modifier);
	}
}